

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_135799e::ResizeRealtimeTest_TestInternalResizeDownUpChangeBitRateScreen_Test::
TestBody(ResizeRealtimeTest_TestInternalResizeDownUpChangeBitRateScreen_Test *this)

{
  EncoderTest *pEVar1;
  FrameInfo *pFVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint *val1;
  SEARCH_METHODS *pSVar6;
  uint uVar7;
  AssertHelper local_d0;
  AssertHelper local_c8;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  int resize_down_count;
  uint last_h;
  uint last_w;
  I420VideoSource video;
  
  std::__cxx11::string::string
            ((string *)&gtest_fatal_failure_checker,"hantro_collage_w352h288.yuv",
             (allocator *)&local_d0);
  libaom_test::I420VideoSource::I420VideoSource
            (&video,(string *)&gtest_fatal_failure_checker,0x160,0x120,0x1e,1,0,300);
  std::__cxx11::string::~string((string *)&gtest_fatal_failure_checker);
  (this->super_ResizeRealtimeTest).super_EncoderTest.init_flags_ = 0x10000;
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.g_w = 0x160;
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.g_h = 0x120;
  (this->super_ResizeRealtimeTest).change_bitrate_ = true;
  (this->super_ResizeRealtimeTest).frame_change_bitrate_ = 0x78;
  (this->super_ResizeRealtimeTest).mismatch_psnr_ = 0.0;
  *(undefined8 *)((long)&(this->super_ResizeRealtimeTest).mismatch_psnr_ + 7) = 0;
  (this->super_ResizeRealtimeTest).is_screen_ = true;
  ResizeRealtimeTest::DefaultConfig(&this->super_ResizeRealtimeTest);
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.rc_dropframe_thresh = 0;
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.rc_resize_mode = 3;
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.rc_target_bitrate = 100;
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.g_forced_max_frame_width = 0x500;
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.g_forced_max_frame_height = 0x500;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      pEVar1 = &(this->super_ResizeRealtimeTest).super_EncoderTest;
      (*pEVar1->_vptr_EncoderTest[2])(pEVar1,&video);
    }
    bVar3 = gtest_fatal_failure_checker.has_new_fatal_failure_;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (bVar3 == false) {
      uVar5 = (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.g_w;
      uVar4 = (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.g_h;
      resize_down_count = 0;
      pFVar2 = (this->super_ResizeRealtimeTest).frame_info_list_.
               super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar7 = 0;
      last_h = uVar4;
      last_w = uVar5;
      for (val1 = &((this->super_ResizeRealtimeTest).frame_info_list_.
                    super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start)->h;
          (FrameInfo *)(val1 + -3) != pFVar2; val1 = val1 + 4) {
        if ((val1[-1] != uVar5) || (*val1 != uVar4)) {
          uVar5 = val1[-1];
          if (uVar7 < (this->super_ResizeRealtimeTest).frame_change_bitrate_) {
            testing::internal::CmpHelperLT<unsigned_int,unsigned_int>
                      ((internal *)&gtest_fatal_failure_checker,"info.w","last_w",val1 + -1,&last_w)
            ;
            if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                      _vptr_TestPartResultReporterInterface == '\0') {
              testing::Message::Message((Message *)&local_d0);
              if ((undefined8 *)
                  CONCAT71(gtest_fatal_failure_checker._9_7_,
                           gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0)
              {
                pSVar6 = "";
              }
              else {
                pSVar6 = *(SEARCH_METHODS **)
                          CONCAT71(gtest_fatal_failure_checker._9_7_,
                                   gtest_fatal_failure_checker.has_new_fatal_failure_);
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_c8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
                         ,0x3f4,(char *)pSVar6);
              testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
              testing::internal::AssertHelper::~AssertHelper(&local_c8);
              if ((long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) + 8))();
              }
              goto LAB_005f053d;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&gtest_fatal_failure_checker.has_new_fatal_failure_);
            testing::internal::CmpHelperLT<unsigned_int,unsigned_int>
                      ((internal *)&gtest_fatal_failure_checker,"info.h","last_h",val1,&last_h);
            if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                      _vptr_TestPartResultReporterInterface == '\0') {
              testing::Message::Message((Message *)&local_d0);
              if ((undefined8 *)
                  CONCAT71(gtest_fatal_failure_checker._9_7_,
                           gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0)
              {
                pSVar6 = "";
              }
              else {
                pSVar6 = *(SEARCH_METHODS **)
                          CONCAT71(gtest_fatal_failure_checker._9_7_,
                                   gtest_fatal_failure_checker.has_new_fatal_failure_);
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_c8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
                         ,0x3f5,(char *)pSVar6);
              testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
              testing::internal::AssertHelper::~AssertHelper(&local_c8);
              if ((long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) + 8))();
              }
              goto LAB_005f053d;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&gtest_fatal_failure_checker.has_new_fatal_failure_);
            resize_down_count = resize_down_count + 1;
            uVar5 = val1[-1];
          }
          uVar4 = *val1;
          last_h = uVar4;
          last_w = uVar5;
        }
        uVar7 = uVar7 + 1;
      }
      local_d0.data_._0_4_ = 1;
      testing::internal::CmpHelperGE<int,int>
                ((internal *)&gtest_fatal_failure_checker,"resize_down_count","1",&resize_down_count
                 ,(int *)&local_d0);
      if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                _vptr_TestPartResultReporterInterface == '\0') {
        testing::Message::Message((Message *)&local_d0);
        std::operator<<((ostream *)(CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) + 0x10),
                        "Resizing down should occur at lease once.");
        if ((undefined8 *)
            CONCAT71(gtest_fatal_failure_checker._9_7_,
                     gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
          pSVar6 = "";
        }
        else {
          pSVar6 = *(SEARCH_METHODS **)
                    CONCAT71(gtest_fatal_failure_checker._9_7_,
                             gtest_fatal_failure_checker.has_new_fatal_failure_);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
                   ,0x3ff,(char *)pSVar6);
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        if ((long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) + 8))();
        }
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&gtest_fatal_failure_checker.has_new_fatal_failure_);
        local_d0.data_._0_4_ = 0;
        local_c8.data_._0_4_ = (this->super_ResizeRealtimeTest).mismatch_nframes_;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  ((internal *)&gtest_fatal_failure_checker,"static_cast<unsigned int>(0)",
                   "GetMismatchFrames()",(uint *)&local_d0,(uint *)&local_c8);
        if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface == '\0') {
          testing::Message::Message((Message *)&local_d0);
          if ((undefined8 *)
              CONCAT71(gtest_fatal_failure_checker._9_7_,
                       gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
            pSVar6 = "";
          }
          else {
            pSVar6 = *(SEARCH_METHODS **)
                      CONCAT71(gtest_fatal_failure_checker._9_7_,
                               gtest_fatal_failure_checker.has_new_fatal_failure_);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_c8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
                     ,0x401,(char *)pSVar6);
          testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
          testing::internal::AssertHelper::~AssertHelper(&local_c8);
          if ((long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) + 8))();
          }
        }
      }
LAB_005f053d:
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_fatal_failure_checker.has_new_fatal_failure_);
      goto LAB_005f0542;
    }
  }
  testing::Message::Message((Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::AssertHelper
            (&local_d0,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
             ,0x3e9,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&local_d0,(Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::~AssertHelper(&local_d0);
  if ((long *)CONCAT71(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                       _vptr_TestPartResultReporterInterface._1_7_,
                       (char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                             _vptr_TestPartResultReporterInterface) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(gtest_fatal_failure_checker.super_TestPartResultReporterInterface
                                   ._vptr_TestPartResultReporterInterface._1_7_,
                                   (char)gtest_fatal_failure_checker.
                                         super_TestPartResultReporterInterface.
                                         _vptr_TestPartResultReporterInterface) + 8))();
  }
LAB_005f0542:
  libaom_test::YUVVideoSource::~YUVVideoSource(&video.super_YUVVideoSource);
  return;
}

Assistant:

TEST_P(ResizeRealtimeTest, TestInternalResizeDownUpChangeBitRateScreen) {
  ::libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352, 288,
                                       30, 1, 0, 300);
  init_flags_ = AOM_CODEC_USE_PSNR;
  cfg_.g_w = 352;
  cfg_.g_h = 288;
  change_bitrate_ = true;
  frame_change_bitrate_ = 120;
  set_scale_mode_ = false;
  set_scale_mode2_ = false;
  set_scale_mode3_ = false;
  mismatch_psnr_ = 0.0;
  mismatch_nframes_ = 0;
  is_screen_ = true;
  DefaultConfig();
  // Disable dropped frames.
  cfg_.rc_dropframe_thresh = 0;
  // Starting bitrate low.
  cfg_.rc_target_bitrate = 100;
  cfg_.rc_resize_mode = RESIZE_DYNAMIC;
  cfg_.g_forced_max_frame_width = 1280;
  cfg_.g_forced_max_frame_height = 1280;
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));

#if CONFIG_AV1_DECODER
  unsigned int last_w = cfg_.g_w;
  unsigned int last_h = cfg_.g_h;
  unsigned int frame_number = 0;
  int resize_down_count = 0;
  for (const auto &info : frame_info_list_) {
    if (info.w != last_w || info.h != last_h) {
      if (frame_number < frame_change_bitrate_) {
        // Verify that resize down occurs, before bitrate is increased.
        ASSERT_LT(info.w, last_w);
        ASSERT_LT(info.h, last_h);
        resize_down_count++;
      }
      last_w = info.w;
      last_h = info.h;
    }
    frame_number++;
  }

  // Verify that we get at least 1 resize event in this test.
  ASSERT_GE(resize_down_count, 1)
      << "Resizing down should occur at lease once.";
  EXPECT_EQ(static_cast<unsigned int>(0), GetMismatchFrames());
#else
  printf("Warning: AV1 decoder unavailable, unable to check resize count!\n");
#endif
}